

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec7Perform(word *t0,int fDerive)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  uchar *pTruth;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 local_a8;
  word wStack_a0;
  uint local_94;
  uint local_90;
  int local_8c;
  ulong local_88;
  undefined8 local_80;
  int Pla2Var [7];
  int Var2Pla [7];
  
  local_a8 = *t0;
  wStack_a0 = t0[1];
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    Var2Pla[lVar3] = (int)lVar3;
    Pla2Var[lVar3] = (int)lVar3;
  }
  uVar4 = 0;
  local_8c = fDerive;
  do {
    if ((int)uVar4 == 7) {
      return 0;
    }
    local_90 = (int)uVar4 + 1;
    local_94 = local_90;
    local_88 = uVar4;
LAB_003770e7:
    local_80 = (ulong)local_90;
    if (local_90 != 7) {
      uVar9 = local_90 + 1;
      local_90 = uVar9;
LAB_003770fe:
      uVar1 = local_80;
      if (uVar9 < 7) {
        uVar8 = 0;
        If_Dec7MoveTo(&local_a8,(int)uVar4,0,Pla2Var,Var2Pla);
        If_Dec7MoveTo(&local_a8,(int)uVar1,1,Pla2Var,Var2Pla);
        If_Dec7MoveTo(&local_a8,uVar9,2,Pla2Var,Var2Pla);
        uVar4 = 1;
        do {
          iVar7 = (int)uVar8;
          if (uVar4 == 0x10) {
            if (iVar7 == 0) {
              __assert_fail("iCof2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                            ,0xe3,"int If_Dec7CofCount3(word *)");
            }
            if (local_8c != 0) {
              uVar5 = 0;
              uVar9 = (uint)(byte)local_a8;
              for (lVar3 = 1; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                uVar6 = 1 << ((byte)lVar3 & 0x1f);
                uVar2 = (uint)*(byte *)((long)&local_a8 + lVar3);
                if ((byte)local_a8 == *(byte *)((long)&local_a8 + lVar3)) {
                  uVar6 = 0;
                  uVar2 = uVar9;
                }
                uVar9 = uVar2;
                uVar5 = uVar5 | uVar6;
              }
              uVar4 = (ulong)(int)uVar5;
              for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 4) {
                uVar4 = uVar4 | (long)*(int *)((long)Pla2Var + lVar3 + -4) << ((byte)lVar3 & 0x3f);
              }
              uVar4 = uVar4 | (ulong)(uVar9 << 8 | (uint)(byte)local_a8) << 0x20;
              for (lVar3 = 0x30; lVar3 != 0x3c; lVar3 = lVar3 + 4) {
                uVar4 = uVar4 | (long)*(int *)((long)&local_a8 + lVar3) << ((byte)lVar3 & 0x3f);
              }
              return uVar4 | 0x7000000000000000;
            }
            return 1;
          }
          if (*(byte *)((long)&local_a8 + uVar4) != (byte)local_a8) {
            if (iVar7 == 0) {
              uVar8 = uVar4 & 0xffffffff;
            }
            else if (*(byte *)((long)&local_a8 + uVar4) != *(byte *)((long)&local_a8 + (long)iVar7))
            goto LAB_00377183;
          }
          uVar4 = uVar4 + 1;
        } while( true );
      }
      goto LAB_003770e7;
    }
    uVar4 = (ulong)local_94;
  } while( true );
LAB_00377183:
  uVar9 = uVar9 + 1;
  uVar4 = local_88;
  goto LAB_003770fe;
}

Assistant:

word If_Dec7Perform( word t0[2], int fDerive )
{
    word t[2] = {t0[0], t0[1]}; 
    int i, v, u, y, Pla2Var[7], Var2Pla[7];
    // start arrays
    for ( i = 0; i < 7; i++ )
    {
/*
        if ( i < 6 )
            assert( If_Dec6HasVar( t[0], i ) || If_Dec6HasVar( t[1], i ) );
        else
            assert( t[0] != t[1] );
*/
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    for ( v = 0;   v < 7; v++ )
    for ( u = v+1; u < 7; u++ )
    for ( y = u+1; y < 7; y++ )
    {
        If_Dec7MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, u, 1, Pla2Var, Var2Pla );
        If_Dec7MoveTo( t, y, 2, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        if ( If_Dec7CofCount3( t ) == 2 )
        {
            return !fDerive ? 1 : If_Dec7DeriveDisjoint( t, Pla2Var, Var2Pla );
        }
    }
    return 0;
}